

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

bool __thiscall Datetime::validate(Datetime *this)

{
  uint year;
  int iVar1;
  int iVar2;
  
  year = this->_year;
  if (year == 0 || 0xffffe05b < year - 10000) {
    if (0xc < (uint)this->_month) {
      return false;
    }
    if (0x35 < (uint)this->_week) {
      return false;
    }
    if (this->_weekday <= (int)((weekstart == 1) + 6) &&
        (int)(uint)(weekstart == 1) <= this->_weekday) {
      iVar1 = this->_julian;
      if (iVar1 != 0) {
        if (iVar1 < 1) {
          return false;
        }
        if (((year & 3) != 0) || (iVar2 = 0x16e, year == (year / 100) * 100)) {
          iVar2 = ((year * -0x3d70a3d7 >> 4 | year * -0x70000000) < 0xa3d70b) + 0x16d;
        }
        if (iVar2 < iVar1) {
          return false;
        }
      }
      iVar1 = this->_day;
      if (iVar1 == 0) {
        if ((uint)this->_seconds < 0x15181) goto LAB_0010929f;
      }
      else if (0 < iVar1) {
        iVar2 = daysInMonth(year,this->_month);
        if (iVar2 < iVar1) {
          return false;
        }
        if (0x15180 < (uint)this->_seconds) {
          return false;
        }
LAB_0010929f:
        return this->_offset + 0x15180U < 0x2a301;
      }
    }
  }
  return false;
}

Assistant:

bool Datetime::validate ()
{
  // for ISO 8601 week specification: YYYY-Www-D where D is 1-7 (Mon-Sun)
  int wks = (Datetime::weekstart == 1 ? 1: 0);
  int wke = (Datetime::weekstart == 1 ? 7: 6);

  // _year;
  if ((_year    && (_year    <   1900 || _year    >                                  9999)) ||
      (_month   && (_month   <      1 || _month   >                                    12)) ||
      (_week    && (_week    <      1 || _week    >                                    53)) ||
      (true     && (_weekday <    wks || _weekday >                                   wke)) ||
      (_julian  && (_julian  <      1 || _julian  >          Datetime::daysInYear (_year))) ||
      (_day     && (_day     <      1 || _day     > Datetime::daysInMonth (_year, _month))) ||
      (_seconds && (_seconds <      1 || _seconds >                                 86400)) ||
      (_offset  && (_offset  < -86400 || _offset  >                                 86400)))
    return false;

  return true;
}